

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

char * absl::lts_20250127::anon_unknown_1::Format64(char *ep,int width,int64_t v)

{
  char *pcVar1;
  long local_20;
  int64_t v_local;
  char *pcStack_10;
  int width_local;
  char *ep_local;
  
  local_20 = v;
  v_local._4_4_ = width;
  pcStack_10 = ep;
  do {
    v_local._4_4_ = v_local._4_4_ + -1;
    pcVar1 = pcStack_10 + -1;
    pcStack_10[-1] = (char)(local_20 % 10) + '0';
    local_20 = local_20 / 10;
    pcStack_10 = pcVar1;
  } while (local_20 != 0);
  while (v_local._4_4_ = v_local._4_4_ + -1, -1 < v_local._4_4_) {
    pcStack_10[-1] = '0';
    pcStack_10 = pcStack_10 + -1;
  }
  return pcStack_10;
}

Assistant:

char* Format64(char* ep, int width, int64_t v) {
  do {
    --width;
    *--ep = static_cast<char>('0' + (v % 10));  // contiguous digits
  } while (v /= 10);
  while (--width >= 0) *--ep = '0';  // zero pad
  return ep;
}